

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * cuddZddChange(DdManager *dd,DdNode *P,int var)

{
  DdNode *zvar_00;
  DdNode *res;
  DdNode *zvar;
  int var_local;
  DdNode *P_local;
  DdManager *dd_local;
  
  zvar_00 = cuddUniqueInterZdd(dd,var,dd->one,dd->zero);
  if (zvar_00 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)zvar_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)zvar_00 & 0xfffffffffffffffe) + 4) + 1;
    dd_local = (DdManager *)cuddZddChangeAux(dd,P,zvar_00);
    if (dd_local == (DdManager *)0x0) {
      Cudd_RecursiveDerefZdd(dd,zvar_00);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDerefZdd(dd,zvar_00);
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddZddChange(
  DdManager * dd,
  DdNode * P,
  int  var)
{
    DdNode      *zvar, *res;

    zvar = cuddUniqueInterZdd(dd, var, DD_ONE(dd), DD_ZERO(dd));
    if (zvar == NULL) return(NULL);
    cuddRef(zvar);

    res = cuddZddChangeAux(dd, P, zvar);
    if (res == NULL) {
        Cudd_RecursiveDerefZdd(dd,zvar);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDerefZdd(dd,zvar);
    cuddDeref(res);
    return(res);

}